

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

void __thiscall ncnn::LSTM::LSTM(LSTM *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__LSTM_0018cb20;
  (this->weight_hc_data).data = (void *)0x0;
  (this->weight_hc_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_hc_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_hc_data).elemsize + 4) = 0;
  (this->bias_c_data).allocator = (Allocator *)0x0;
  (this->bias_c_data).dims = 0;
  (this->bias_c_data).w = 0;
  (this->bias_c_data).h = 0;
  (this->bias_c_data).c = 0;
  (this->bias_c_data).cstep = 0;
  (this->weight_hc_data).allocator = (Allocator *)0x0;
  (this->weight_hc_data).dims = 0;
  (this->weight_hc_data).w = 0;
  (this->weight_hc_data).h = 0;
  (this->weight_hc_data).c = 0;
  (this->weight_hc_data).cstep = 0;
  (this->weight_xc_data).data = (void *)0x0;
  (this->weight_xc_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_xc_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_xc_data).elemsize + 4) = 0;
  (this->weight_xc_data).allocator = (Allocator *)0x0;
  (this->weight_xc_data).dims = 0;
  (this->weight_xc_data).w = 0;
  (this->weight_xc_data).h = 0;
  (this->weight_xc_data).c = 0;
  (this->weight_xc_data).cstep = 0;
  (this->bias_c_data).data = (void *)0x0;
  (this->bias_c_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->bias_c_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->bias_c_data).elemsize + 4) = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

LSTM::LSTM()
{
    one_blob_only = true;
    support_inplace = false;
}